

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void lhInitCursor(unqlite_kv_cursor *pPtr)

{
  *(undefined4 *)&pPtr[1].pStore = 1;
  pPtr[2].pStore = (unqlite_kv_engine *)0x0;
  pPtr[4].pStore = (unqlite_kv_engine *)pPtr->pStore[0x1e].pIo;
  pPtr[3].pStore = (unqlite_kv_engine *)0x0;
  *(undefined4 *)((long)&pPtr[1].pStore + 4) = 1;
  return;
}

Assistant:

static void lhInitCursor(unqlite_kv_cursor *pPtr)
{
	 lhash_kv_engine *pEngine = (lhash_kv_engine *)pPtr->pStore;
	 lhash_kv_cursor *pCur = (lhash_kv_cursor *)pPtr;
	 /* Init */
	 pCur->iState = L_HASH_CURSOR_STATE_NEXT_PAGE;
	 pCur->pCell = 0;
	 pCur->pRec = pEngine->pFirst;
	 pCur->pRaw = 0;
	 pCur->is_first = 1;
}